

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

container_t *
containerptr_roaring_bitmap_add(roaring_bitmap_t *r,uint32_t val,uint8_t *type,int *index)

{
  array_container_t *c_00;
  roaring_bitmap_t *c_01;
  container_t *c_1;
  array_container_t *new_ac;
  container_t *c2;
  roaring_bitmap_t *prStack_48;
  uint8_t new_type;
  container_t *c;
  int i;
  uint16_t hb;
  roaring_array_t *ra;
  int *index_local;
  uint8_t *type_local;
  roaring_bitmap_t *prStack_18;
  uint32_t val_local;
  roaring_bitmap_t *r_local;
  
  c._6_2_ = (uint16_t)(val >> 0x10);
  _i = &r->high_low_container;
  ra = (roaring_array_t *)index;
  index_local = (int *)type;
  type_local._4_4_ = val;
  prStack_18 = r;
  c._0_4_ = ra_get_index(&r->high_low_container,c._6_2_);
  if ((int32_t)c < 0) {
    c_00 = array_container_create();
    c_01 = (roaring_bitmap_t *)
           container_add(c_00,(uint16_t)type_local._4_4_,'\x02',(uint8_t *)index_local);
    ra_insert_new_key_value_at(_i,-1 - (int32_t)c,c._6_2_,c_01,(uint8_t)*index_local);
    ra->size = -1 - (int32_t)c;
    r_local = c_01;
  }
  else {
    ra_unshare_container_at_index(_i,(uint16_t)(int32_t)c);
    prStack_48 = (roaring_bitmap_t *)
                 ra_get_container_at_index(_i,(uint16_t)(int32_t)c,(uint8_t *)index_local);
    c2._7_1_ = (uint8_t)*index_local;
    r_local = (roaring_bitmap_t *)
              container_add(prStack_48,(uint16_t)type_local._4_4_,(uint8_t)*index_local,
                            (uint8_t *)((long)&c2 + 7));
    ra->size = (int32_t)c;
    if (r_local == prStack_48) {
      r_local = prStack_48;
    }
    else {
      container_free(prStack_48,(uint8_t)*index_local);
      ra_set_container_at_index(_i,(int32_t)c,r_local,c2._7_1_);
      *(uint8_t *)index_local = c2._7_1_;
    }
  }
  return r_local;
}

Assistant:

static inline container_t *containerptr_roaring_bitmap_add(
    roaring_bitmap_t *r, uint32_t val,
    uint8_t *type, int *index
){
    roaring_array_t *ra = &r->high_low_container;

    uint16_t hb = val >> 16;
    const int i = ra_get_index(ra, hb);
    if (i >= 0) {
        ra_unshare_container_at_index(ra, i);
        container_t *c = ra_get_container_at_index(ra, i, type);
        uint8_t new_type = *type;
        container_t *c2 = container_add(c, val & 0xFFFF, *type, &new_type);
        *index = i;
        if (c2 != c) {
            container_free(c, *type);
            ra_set_container_at_index(ra, i, c2, new_type);
            *type = new_type;
            return c2;
        } else {
            return c;
        }
    } else {
        array_container_t *new_ac = array_container_create();
        container_t *c = container_add(new_ac, val & 0xFFFF,
                                       ARRAY_CONTAINER_TYPE, type);
        // we could just assume that it stays an array container
        ra_insert_new_key_value_at(ra, -i - 1, hb, c, *type);
        *index = -i - 1;
        return c;
    }
}